

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

bool crnlib::command_line_params::load_string_file(char *pFilename,dynamic_string_array *strings)

{
  undefined8 this;
  bool bVar1;
  uint uVar2;
  char *p;
  dynamic_string local_90;
  undefined1 local_80 [8];
  dynamic_string ansi_str;
  undefined1 local_60 [8];
  cfile_stream in_stream;
  dynamic_string_array *strings_local;
  char *pFilename_local;
  
  in_stream._56_8_ = strings;
  cfile_stream::cfile_stream((cfile_stream *)local_60);
  uVar2 = cfile_stream::open((cfile_stream *)local_60,pFilename,5,0);
  if ((uVar2 & 1) == 0) {
    console::error("Unable to open file \"%s\" for reading!",pFilename);
    pFilename_local._7_1_ = false;
    ansi_str.m_pStr._0_4_ = 1;
  }
  else {
    dynamic_string::dynamic_string((dynamic_string *)local_80);
    while (bVar1 = data_stream::read_line((data_stream *)local_60,(dynamic_string *)local_80), bVar1
          ) {
      dynamic_string::trim((dynamic_string *)local_80);
      bVar1 = dynamic_string::is_empty((dynamic_string *)local_80);
      this = in_stream._56_8_;
      if (!bVar1) {
        p = dynamic_string::get_ptr((dynamic_string *)local_80);
        dynamic_string::dynamic_string(&local_90,p);
        vector<crnlib::dynamic_string>::push_back((vector<crnlib::dynamic_string> *)this,&local_90);
        dynamic_string::~dynamic_string(&local_90);
      }
    }
    pFilename_local._7_1_ = true;
    ansi_str.m_pStr._0_4_ = 1;
    dynamic_string::~dynamic_string((dynamic_string *)local_80);
  }
  cfile_stream::~cfile_stream((cfile_stream *)local_60);
  return pFilename_local._7_1_;
}

Assistant:

bool command_line_params::load_string_file(const char* pFilename, dynamic_string_array& strings)
    {
        cfile_stream in_stream;
        if (!in_stream.open(pFilename, cDataStreamReadable | cDataStreamSeekable))
        {
            console::error("Unable to open file \"%s\" for reading!", pFilename);
            return false;
        }

        dynamic_string ansi_str;

        for (;;)
        {
            if (!in_stream.read_line(ansi_str))
            {
                break;
            }
            ansi_str.trim();
            if (ansi_str.is_empty())
            {
                continue;
            }
            strings.push_back(dynamic_string(ansi_str.get_ptr()));
        }

        return true;
    }